

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O3

Char * Diligent::GetTexViewTypeLiteralName(TEXTURE_VIEW_TYPE ViewType)

{
  char *pcVar1;
  string msg;
  char (*in_stack_ffffffffffffffc8) [2];
  char local_30 [4];
  uint local_2c;
  string local_28;
  
  if (GetTexViewTypeLiteralName(Diligent::TEXTURE_VIEW_TYPE)::TexViewTypeToLiteralName == '\0') {
    GetTexViewTypeLiteralName();
  }
  if (ViewType < TEXTURE_VIEW_NUM_VIEWS) {
    pcVar1 = GetTexViewTypeLiteralName::TexViewTypeToLiteralName.TexViewLiteralNames._M_elems
             [ViewType];
  }
  else {
    local_2c = (uint)ViewType;
    local_30[0] = '\x06';
    local_30[1] = '\0';
    local_30[2] = '\0';
    local_30[3] = '\0';
    FormatString<char[20],unsigned_int,char[31],unsigned_int,char[2]>
              (&local_28,(Diligent *)"Texture view type (",(char (*) [20])&local_2c,
               (uint *)") is out of allowed range [0, ",(char (*) [31])local_30,(uint *)0x33b93f,
               in_stack_ffffffffffffffc8);
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"operator[]",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x2d7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    pcVar1 = "<Unknown texture view type>";
  }
  return pcVar1;
}

Assistant:

const Char* GetTexViewTypeLiteralName(TEXTURE_VIEW_TYPE ViewType)
{
    struct TexViewTypeToLiteralNameMap
    {
        TexViewTypeToLiteralNameMap()
        {
#define INIT_TEX_VIEW_TYPE_NAME(ViewType) TexViewLiteralNames[ViewType] = #ViewType
            INIT_TEX_VIEW_TYPE_NAME(TEXTURE_VIEW_UNDEFINED);
            INIT_TEX_VIEW_TYPE_NAME(TEXTURE_VIEW_SHADER_RESOURCE);
            INIT_TEX_VIEW_TYPE_NAME(TEXTURE_VIEW_RENDER_TARGET);
            INIT_TEX_VIEW_TYPE_NAME(TEXTURE_VIEW_DEPTH_STENCIL);
            INIT_TEX_VIEW_TYPE_NAME(TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL);
            INIT_TEX_VIEW_TYPE_NAME(TEXTURE_VIEW_UNORDERED_ACCESS);
            INIT_TEX_VIEW_TYPE_NAME(TEXTURE_VIEW_SHADING_RATE);
#undef INIT_TEX_VIEW_TYPE_NAME
            static_assert(TEXTURE_VIEW_NUM_VIEWS == 7, "Not all texture views names are initialized.");
        }

        const Char* operator[](TEXTURE_VIEW_TYPE ViewType) const
        {
            if (ViewType >= TEXTURE_VIEW_UNDEFINED && ViewType < TEXTURE_VIEW_NUM_VIEWS)
            {
                return TexViewLiteralNames[ViewType];
            }
            else
            {
                UNEXPECTED("Texture view type (", static_cast<Uint32>(ViewType), ") is out of allowed range [0, ", static_cast<Uint32>(TEXTURE_VIEW_NUM_VIEWS) - 1, "]");
                return "<Unknown texture view type>";
            }
        }

    private:
        std::array<const Char*, TEXTURE_VIEW_NUM_VIEWS> TexViewLiteralNames{};
    };

    static const TexViewTypeToLiteralNameMap TexViewTypeToLiteralName;
    return TexViewTypeToLiteralName[ViewType];
}